

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v6::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  char *pcVar1;
  int iVar2;
  void *__buf;
  undefined **__n;
  size_t in_R8;
  string_view message_00;
  char *system_message;
  writer w;
  memory_buffer buf;
  
  message_00.data_ = (char *)message.size_;
  buf.super_buffer<char>.ptr_ = buf.store_;
  buf.super_buffer<char>.size_ = 0;
  __n = &PTR_grow_0017f298;
  buf.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0017f298;
  buf.super_buffer<char>.capacity_ = 500;
  internal::buffer<char>::resize(&buf.super_buffer<char>,500);
  while( true ) {
    system_message = buf.super_buffer<char>.ptr_;
    iVar2 = internal::safe_strerror(error_code,&system_message,buf.super_buffer<char>.size_);
    if (iVar2 != 0x22) break;
    internal::buffer<char>::resize(&buf.super_buffer<char>,buf.super_buffer<char>.size_ * 2);
  }
  if (iVar2 == 0) {
    w.locale_.locale_ = (void *)0x0;
    w.out_.container = out;
    internal::basic_writer<fmt::v6::buffer_range<char>_>::write
              (&w,(int)message.data_,message_00.data_,(size_t)__n);
    internal::basic_writer<fmt::v6::buffer_range<char>_>::write(&w,0x158124,(void *)0x2,(size_t)__n)
    ;
    pcVar1 = system_message;
    __buf = (void *)strlen(system_message);
    internal::basic_writer<fmt::v6::buffer_range<char>_>::write(&w,(int)pcVar1,__buf,(size_t)__n);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&buf);
  }
  else {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&buf);
    message_00.size_ = in_R8;
    internal::format_error_code
              ((internal *)out,(buffer<char> *)(ulong)(uint)error_code,(int)message.data_,message_00
              );
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(internal::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          internal::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        internal::writer w(out);
        w.write(message);
        w.write(": ");
        w.write(system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }